

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verilogAST.cpp
# Opt level: O0

string * __thiscall verilogAST::Port::toString_abi_cxx11_(string *__return_storage_ptr__,Port *this)

{
  Direction DVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  undefined1 local_88 [8];
  string data_type_str;
  undefined1 local_58 [8];
  string direction_str;
  string value_str;
  Port *this_local;
  
  variant_to_string<std::unique_ptr<verilogAST::Identifier,std::default_delete<verilogAST::Identifier>>,std::unique_ptr<verilogAST::Vector,std::default_delete<verilogAST::Vector>>>
            ((string *)((long)&direction_str.field_2 + 8),&this->value);
  std::__cxx11::string::string((string *)local_58);
  DVar1 = this->direction;
  if (DVar1 == INPUT) {
    std::__cxx11::string::operator=((string *)local_58,"input");
  }
  else if (DVar1 == OUTPUT) {
    std::__cxx11::string::operator=((string *)local_58,"output");
  }
  else if (DVar1 == INOUT) {
    std::__cxx11::string::operator=((string *)local_58,"inout");
  }
  std::__cxx11::string::string((string *)local_88);
  if (this->data_type == WIRE) {
    std::__cxx11::string::operator=((string *)local_88,"");
  }
  else if (this->data_type == REG) {
    std::__cxx11::string::operator=((string *)local_88,"reg ");
  }
  std::operator+(&local_c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58," ");
  std::operator+(&local_a8,&local_c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
  std::operator+(__return_storage_ptr__,&local_a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&direction_str.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)(direction_str.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string Port::toString() {
  std::string value_str =
      variant_to_string<std::unique_ptr<Identifier>, std::unique_ptr<Vector>>(
          value);
  std::string direction_str;
  switch (direction) {
    case INPUT:
      direction_str = "input";
      break;
    case OUTPUT:
      direction_str = "output";
      break;
    case INOUT:
      direction_str = "inout";
      break;
  }

  std::string data_type_str;
  switch (data_type) {
    case WIRE:
      data_type_str = "";
      break;
    case REG:
      data_type_str = "reg ";
      break;
  }
  return direction_str + " " + data_type_str + value_str;
}